

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.h
# Opt level: O0

void __thiscall
embree::CommandLineParser::
CommandLineOptionClosure<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/tutorials/common/tutorial/tutorial.cpp:184:26)>
::parse(CommandLineOptionClosure<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_common_tutorial_tutorial_cpp:184:26)>
        *this,Ref<embree::ParseStream> *cin,FileName *path)

{
  long *in_RSI;
  FileName *in_stack_ffffffffffffffb0;
  Ref<embree::ParseStream> *in_stack_ffffffffffffffb8;
  anon_class_8_1_8991fb9c_for_f *this_00;
  
  this_00 = (anon_class_8_1_8991fb9c_for_f *)*in_RSI;
  if (this_00 != (anon_class_8_1_8991fb9c_for_f *)0x0) {
    (*(code *)(this_00->this->super_Application).rtcore._M_string_length)();
  }
  anon_class_8_1_8991fb9c_for_f::operator()
            (this_00,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  if (this_00 != (anon_class_8_1_8991fb9c_for_f *)0x0) {
    (*(code *)(this_00->this->super_Application).rtcore.field_2._M_allocated_capacity)();
  }
  return;
}

Assistant:

virtual void parse(Ref<ParseStream> cin, const FileName& path) {
        f(cin,path);
      }